

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::ClassId(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZStackEqnStorage<std::complex<long_double>_> *in_RDI;
  allocator<char> *in_stack_fffffffffffa5aa0;
  char *in_stack_fffffffffffa5aa8;
  TPZStackEqnStorage<std::complex<long_double>_> *in_stack_fffffffffffa5ab0;
  TPZFrontSym<std::complex<long_double>_> *in_stack_fffffffffffa5ac0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffa5ab0,in_stack_fffffffffffa5aa8,in_stack_fffffffffffa5aa0);
  uVar1 = Hash((string *)in_RDI);
  iVar2 = TPZAbstractFrontMatrix<std::complex<long_double>_>::ClassId
                    ((TPZAbstractFrontMatrix<std::complex<long_double>_> *)in_stack_fffffffffffa5ac0
                    );
  uVar1 = uVar1 ^ iVar2 * 2;
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage(in_RDI);
  iVar2 = TPZStackEqnStorage<std::complex<long_double>_>::ClassId(in_stack_fffffffffffa5ab0);
  TPZFrontSym<std::complex<long_double>_>::TPZFrontSym
            ((TPZFrontSym<std::complex<long_double>_> *)CONCAT44(uVar1,iVar2));
  iVar3 = TPZFrontSym<std::complex<long_double>_>::ClassId(in_stack_fffffffffffa5ac0);
  TPZFrontSym<std::complex<long_double>_>::~TPZFrontSym
            ((TPZFrontSym<std::complex<long_double>_> *)0x1cff046);
  TPZStackEqnStorage<std::complex<long_double>_>::~TPZStackEqnStorage
            ((TPZStackEqnStorage<std::complex<long_double>_> *)0x1cff053);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 << 2 ^ iVar3 << 3;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}